

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O3

void lys_switch_deviation(lys_deviation *dev,lys_module *module,unres_schema *unres)

{
  ushort uVar1;
  LYS_NODE LVar2;
  lys_node *plVar3;
  lys_ext_instance **pplVar4;
  uint8_t uVar5;
  uint8_t uVar6;
  uint8_t uVar7;
  uint8_t uVar8;
  uint8_t uVar9;
  uint8_t uVar10;
  undefined4 uVar11;
  char cVar12;
  int iVar13;
  char *pcVar14;
  char *pcVar15;
  lys_node *plVar16;
  lys_node *plVar17;
  size_t __n;
  lys_module *module_00;
  ly_ctx *ctx;
  lys_node *plVar18;
  undefined8 uVar19;
  long local_a8;
  lys_ext_instance **pplStack_a0;
  lys_iffeature *local_98;
  ly_set *local_38;
  ly_set *set;
  
  if (dev->deviate == (lys_deviate *)0x0) {
    return;
  }
  if (dev->deviate->mod == LY_DEVIATE_NO) {
    pcVar15 = dev->target_name;
    plVar17 = dev->orig_node;
    if (plVar17 == (lys_node *)0x0) {
      iVar13 = resolve_schema_nodeid(pcVar15,(lys_node *)0x0,module,&local_38,0,1);
      if (iVar13 == -1) {
        ctx = module->ctx;
        uVar19 = 0x11b6;
        goto LAB_001615e5;
      }
      plVar17 = *(local_38->set).s;
      ly_set_free(local_38);
      plVar18 = plVar17->parent;
      lys_node_unlink(plVar17);
      if (plVar18 != (lys_node *)0x0) {
        plVar16 = plVar17;
        if ((plVar18->nodetype & (LYS_AUGMENT|LYS_USES)) == LYS_UNKNOWN) {
          if ((plVar18->nodetype & (LYS_ACTION|LYS_RPC)) == LYS_UNKNOWN) goto LAB_00161686;
          plVar16 = (lys_node *)calloc(1,0x78);
          if (plVar16 == (lys_node *)0x0) {
            ly_log(module->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                   "lys_switch_deviation");
            return;
          }
          LVar2 = plVar17->nodetype;
          plVar16->nodetype = LVar2;
          pcVar15 = "output";
          if (LVar2 == LYS_INPUT) {
            pcVar15 = "input";
          }
          pcVar15 = lydict_insert(module->ctx,pcVar15,0);
          plVar16->name = pcVar15;
          plVar16->module = plVar17->module;
          plVar16->flags = 0x40;
          plVar3 = plVar18->child;
          if (((plVar3 == (lys_node *)0x0) || (plVar3->next != (lys_node *)0x0)) ||
             (plVar3->nodetype != (uint)(LVar2 == LYS_INPUT) * 0x200 + LYS_INPUT)) {
            __assert_fail("parent->child && !parent->child->next && (parent->child->nodetype == (inout->nodetype == LYS_INPUT ? LYS_OUTPUT : LYS_INPUT))"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_schema.c"
                          ,0x11d3,
                          "void lys_switch_deviation(struct lys_deviation *, const struct lys_module *, struct unres_schema *)"
                         );
          }
          plVar3->next = plVar16;
          plVar16->prev = plVar3;
          plVar3->prev = plVar16;
        }
        plVar16->parent = plVar18;
      }
LAB_00161686:
      dev->orig_node = plVar17;
      return;
    }
    pcVar14 = strrchr(pcVar15,0x2f);
    if ((long)pcVar14 - (long)pcVar15 == 0) {
      module_00 = plVar17->module;
      if ((module_00->field_0x40 & 1) != 0) {
        module_00 = (lys_module *)module_00->data;
      }
      plVar18 = (lys_node *)0x0;
    }
    else {
      plVar18 = plVar17->parent;
      if (plVar18 == (lys_node *)0x0) {
LAB_001616f1:
        pcVar15 = strndup(pcVar15,(long)pcVar14 - (long)pcVar15);
        iVar13 = resolve_schema_nodeid(pcVar15,(lys_node *)0x0,module,&local_38,0,1);
        free(pcVar15);
        if (iVar13 == -1) {
          ctx = module->ctx;
          uVar19 = 0x11a3;
LAB_001615e5:
          ly_log(ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_schema.c"
                 ,uVar19);
          ly_set_free(local_38);
          return;
        }
        plVar18 = *(local_38->set).s;
        ly_set_free(local_38);
        plVar17 = dev->orig_node;
        module_00 = (lys_module *)0x0;
      }
      else {
        if (plVar18->nodetype != LYS_USES) {
          if (plVar18->nodetype != LYS_AUGMENT) goto LAB_001616f1;
          plVar17->parent = (lys_node *)0x0;
          if ((plVar18->flags & 1) == 0) {
            remove_aug((lys_node_augment *)plVar18);
            lys_node_addchild(plVar18,(lys_module *)0x0,dev->orig_node,0);
            uVar1 = *(ushort *)&plVar18->module->field_0x40;
            cVar12 = (char)uVar1;
            if ((uVar1 & 1) != 0) {
              cVar12 = (char)*(undefined2 *)&plVar18->module->data->parent;
            }
            if (-1 < cVar12) {
              __assert_fail("lys_node_module(parent)->implemented",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_schema.c"
                            ,0x1196,
                            "void lys_switch_deviation(struct lys_deviation *, const struct lys_module *, struct unres_schema *)"
                           );
            }
            *(byte *)&plVar18->flags = (byte)plVar18->flags | 1;
            apply_aug((lys_node_augment *)plVar18,unres);
            goto LAB_00161774;
          }
        }
        module_00 = (lys_module *)0x0;
      }
    }
    lys_node_addchild(plVar18,module_00,plVar17,0);
LAB_00161774:
    dev->orig_node = (lys_node *)0x0;
    return;
  }
  iVar13 = resolve_schema_nodeid(dev->target_name,(lys_node *)0x0,module,&local_38,0,1);
  if (iVar13 == -1) {
    ctx = module->ctx;
    uVar19 = 0x11df;
    goto LAB_001615e5;
  }
  plVar17 = *(local_38->set).s;
  ly_set_free(local_38);
  plVar18 = dev->orig_node;
  if (((plVar17->module != plVar18->module) || (plVar17->name != plVar18->name)) ||
     (plVar17->nodetype != plVar18->nodetype)) {
    __assert_fail("(node1->module == node2->module) && ly_strequal(node1->name, node2->name, 1) && (node1->nodetype == node2->nodetype)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_schema.c"
                  ,0xe2b,"void lys_node_switch(struct lys_node *, struct lys_node *)");
  }
  local_98 = plVar17->iffeature;
  local_a8._0_2_ = plVar17->flags;
  local_a8._2_1_ = plVar17->ext_size;
  local_a8._3_1_ = plVar17->iffeature_size;
  local_a8._4_1_ = plVar17->padding[0];
  local_a8._5_1_ = plVar17->padding[1];
  local_a8._6_1_ = plVar17->padding[2];
  local_a8._7_1_ = plVar17->padding[3];
  pplStack_a0 = plVar17->ext;
  plVar17->iffeature = plVar18->iffeature;
  uVar5 = plVar18->ext_size;
  uVar6 = plVar18->iffeature_size;
  uVar7 = plVar18->padding[0];
  uVar8 = plVar18->padding[1];
  uVar9 = plVar18->padding[2];
  uVar10 = plVar18->padding[3];
  pplVar4 = plVar18->ext;
  plVar17->flags = plVar18->flags;
  plVar17->ext_size = uVar5;
  plVar17->iffeature_size = uVar6;
  plVar17->padding[0] = uVar7;
  plVar17->padding[1] = uVar8;
  plVar17->padding[2] = uVar9;
  plVar17->padding[3] = uVar10;
  plVar17->ext = pplVar4;
  plVar18->iffeature = local_98;
  plVar18->flags = (undefined2)local_a8;
  plVar18->ext_size = local_a8._2_1_;
  plVar18->iffeature_size = local_a8._3_1_;
  plVar18->padding[0] = local_a8._4_1_;
  plVar18->padding[1] = local_a8._5_1_;
  plVar18->padding[2] = local_a8._6_1_;
  plVar18->padding[3] = local_a8._7_1_;
  plVar18->ext = pplStack_a0;
  LVar2 = plVar17->nodetype;
  if ((int)LVar2 < 0x80) {
    if ((int)LVar2 < 0x10) {
      switch(LVar2) {
      case LYS_CONTAINER:
        __n = 0x20;
        break;
      case LYS_CHOICE:
        goto switchD_0016150a_caseD_2;
      default:
        goto switchD_0016150a_caseD_3;
      case LYS_LEAF:
        __n = 0x60;
        break;
      case LYS_LEAFLIST:
        __n = 0x68;
      }
    }
    else if (LVar2 == LYS_LIST) {
      __n = 0x38;
    }
    else {
      if (LVar2 == LYS_ANYXML) goto LAB_001616d1;
      if (LVar2 != LYS_CASE) goto switchD_0016150a_caseD_3;
      __n = 0;
    }
  }
  else {
    if ((int)LVar2 < 0x400) {
      if (LVar2 == LYS_NOTIF) {
LAB_001616d1:
        __n = 0x10;
        goto LAB_001617b7;
      }
      if ((LVar2 != LYS_RPC) && (LVar2 != LYS_INPUT)) {
switchD_0016150a_caseD_3:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_schema.c"
                      ,0xe8f,"void lys_node_switch(struct lys_node *, struct lys_node *)");
      }
    }
    else if ((LVar2 != LYS_OUTPUT) && (LVar2 != LYS_ACTION)) {
      if (LVar2 != LYS_ANYDATA) goto switchD_0016150a_caseD_3;
      goto LAB_001616d1;
    }
switchD_0016150a_caseD_2:
    __n = 8;
  }
LAB_001617b7:
  memcpy(&local_a8,plVar17 + 1,__n);
  memcpy(plVar17 + 1,plVar18 + 1,__n);
  memcpy(plVar18 + 1,&local_a8,__n);
  LVar2 = plVar17->nodetype;
  if (0x7f < (int)LVar2) {
    if ((int)LVar2 < 0x200) {
      if ((LVar2 != LYS_NOTIF) && (LVar2 != LYS_RPC)) {
        return;
      }
    }
    else {
      if ((LVar2 == LYS_INPUT) || (LVar2 == LYS_OUTPUT)) {
        *(undefined2 *)(plVar17->padding + 2) = *(undefined2 *)(plVar18->padding + 2);
        uVar5 = plVar18->hash[1];
        uVar6 = plVar18->hash[2];
        uVar7 = plVar18->hash[3];
        uVar11 = *(undefined4 *)&plVar18->field_0x6c;
        plVar17->hash[0] = plVar18->hash[0];
        plVar17->hash[1] = uVar5;
        plVar17->hash[2] = uVar6;
        plVar17->hash[3] = uVar7;
        *(undefined4 *)&plVar17->field_0x6c = uVar11;
        plVar18->padding[2] = '\0';
        plVar18->padding[3] = '\0';
        plVar18->hash[0] = '\0';
        plVar18->hash[1] = '\0';
        plVar18->hash[2] = '\0';
        plVar18->hash[3] = '\0';
        *(undefined4 *)&plVar18->field_0x6c = 0;
        return;
      }
      if (LVar2 != LYS_ACTION) {
        return;
      }
    }
    *(undefined2 *)(plVar17->padding + 2) = *(undefined2 *)(plVar18->padding + 2);
    plVar17[1].name = plVar18[1].name;
    plVar18->padding[2] = '\0';
    plVar18->padding[3] = '\0';
    plVar18[1].name = (char *)0x0;
    return;
  }
  if ((int)LVar2 < 8) {
    if (LVar2 == LYS_CONTAINER) {
      *(undefined2 *)(plVar17->padding + 2) = *(undefined2 *)(plVar18->padding + 2);
      plVar17[1].ref = plVar18[1].ref;
      plVar18->padding[2] = '\0';
      plVar18->padding[3] = '\0';
LAB_001618f0:
      plVar18[1].ref = (char *)0x0;
      return;
    }
    if (LVar2 != LYS_LEAF) {
      return;
    }
  }
  else if (LVar2 != LYS_LEAFLIST) {
    if (LVar2 != LYS_LIST) {
      return;
    }
    plVar17->padding[1] = plVar18->padding[1];
    plVar17[1].ref = plVar18[1].ref;
    plVar18->padding[1] = '\0';
    goto LAB_001618f0;
  }
  plVar17[1].iffeature = (lys_iffeature *)plVar17;
  plVar18[1].iffeature = (lys_iffeature *)plVar18;
  return;
}

Assistant:

static void
lys_switch_deviation(struct lys_deviation *dev, const struct lys_module *module, struct unres_schema *unres)
{
    int ret, reapply = 0;
    char *parent_path;
    struct lys_node *target = NULL, *parent;
    struct lys_node_inout *inout;
    struct ly_set *set;

    if (!dev->deviate) {
        return;
    }

    if (dev->deviate[0].mod == LY_DEVIATE_NO) {
        if (dev->orig_node) {
            /* removing not-supported deviation ... */
            if (strrchr(dev->target_name, '/') != dev->target_name) {
                /* ... from a parent */

                /* reconnect to its previous position */
                parent = dev->orig_node->parent;
                if (parent && (parent->nodetype == LYS_AUGMENT)) {
                    dev->orig_node->parent = NULL;
                    /* the original node was actually from augment, we have to get know if the augment is
                     * applied (its module is enabled and implemented). If yes, the node will be connected
                     * to the augment and the linkage with the target will be fixed if needed, otherwise
                     * it will be connected only to the augment */
                    if (!(parent->flags & LYS_NOTAPPLIED)) {
                        /* start with removing augment if applied before adding nodes, we have to make sure
                         * that everything will be connect correctly */
                        remove_aug((struct lys_node_augment *)parent);
                        reapply = 1;
                    }
                    /* connect the deviated node back into the augment */
                    lys_node_addchild(parent, NULL, dev->orig_node, 0);
                    if (reapply) {
                        /* augment is supposed to be applied, so fix pointers in target and the status of the original node */
                        assert(lys_node_module(parent)->implemented);
                        parent->flags |= LYS_NOTAPPLIED; /* allow apply_aug() */
                        apply_aug((struct lys_node_augment *)parent, unres);
                    }
                } else if (parent && (parent->nodetype == LYS_USES)) {
                    /* uses child */
                    lys_node_addchild(parent, NULL, dev->orig_node, 0);
                } else {
                    /* non-augment, non-toplevel */
                    parent_path = strndup(dev->target_name, strrchr(dev->target_name, '/') - dev->target_name);
                    ret = resolve_schema_nodeid(parent_path, NULL, module, &set, 0, 1);
                    free(parent_path);
                    if (ret == -1) {
                        LOGINT(module->ctx);
                        ly_set_free(set);
                        return;
                    }
                    target = set->set.s[0];
                    ly_set_free(set);

                    lys_node_addchild(target, NULL, dev->orig_node, 0);
                }
            } else {
                /* ... from top-level data */
                lys_node_addchild(NULL, lys_node_module(dev->orig_node), dev->orig_node, 0);
            }

            dev->orig_node = NULL;
        } else {
            /* adding not-supported deviation */
            ret = resolve_schema_nodeid(dev->target_name, NULL, module, &set, 0, 1);
            if (ret == -1) {
                LOGINT(module->ctx);
                ly_set_free(set);
                return;
            }
            target = set->set.s[0];
            ly_set_free(set);

            /* unlink and store the original node */
            parent = target->parent;
            lys_node_unlink(target);
            if (parent) {
                if (parent->nodetype & (LYS_AUGMENT | LYS_USES)) {
                    /* hack for augment, because when the original will be sometime reconnected back, we actually need
                     * to reconnect it to both - the augment and its target (which is deduced from the deviations target
                     * path), so we need to remember the augment as an addition */
                    /* we also need to remember the parent uses so that we connect it back to it when switching deviation state */
                    target->parent = parent;
                } else if (parent->nodetype & (LYS_RPC | LYS_ACTION)) {
                    /* re-create implicit node */
                    inout = calloc(1, sizeof *inout);
                    LY_CHECK_ERR_RETURN(!inout, LOGMEM(module->ctx), );

                    inout->nodetype = target->nodetype;
                    inout->name = lydict_insert(module->ctx, (inout->nodetype == LYS_INPUT) ? "input" : "output", 0);
                    inout->module = target->module;
                    inout->flags = LYS_IMPLICIT;

                    /* insert it manually */
                    assert(parent->child && !parent->child->next
                    && (parent->child->nodetype == (inout->nodetype == LYS_INPUT ? LYS_OUTPUT : LYS_INPUT)));
                    parent->child->next = (struct lys_node *)inout;
                    inout->prev = parent->child;
                    parent->child->prev = (struct lys_node *)inout;
                    inout->parent = parent;
                }
            }
            dev->orig_node = target;
        }
    } else {
        ret = resolve_schema_nodeid(dev->target_name, NULL, module, &set, 0, 1);
        if (ret == -1) {
            LOGINT(module->ctx);
            ly_set_free(set);
            return;
        }
        target = set->set.s[0];
        ly_set_free(set);

        /* contents are switched */
        lys_node_switch(target, dev->orig_node);
    }
}